

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O1

void absl::raw_logging_internal::RawLog(LogSeverity severity,char *file,int line,char *format,...)

{
  char in_AL;
  char cVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  int iVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *buf;
  va_list ap;
  char buffer [3000];
  uint local_cd4;
  char *local_cd0;
  int local_cc4;
  char *local_cc0;
  undefined8 local_cb8;
  char **local_cb0;
  undefined1 *local_ca8;
  undefined1 local_c98 [32];
  undefined8 local_c78;
  undefined8 local_c70;
  undefined8 local_c68;
  undefined8 local_c58;
  undefined8 local_c48;
  undefined8 local_c38;
  undefined8 local_c28;
  undefined8 local_c18;
  undefined8 local_c08;
  undefined8 local_bf8;
  char local_be8 [3000];
  
  local_ca8 = local_c98;
  if (in_AL != '\0') {
    local_c68 = in_XMM0_Qa;
    local_c58 = in_XMM1_Qa;
    local_c48 = in_XMM2_Qa;
    local_c38 = in_XMM3_Qa;
    local_c28 = in_XMM4_Qa;
    local_c18 = in_XMM5_Qa;
    local_c08 = in_XMM6_Qa;
    local_bf8 = in_XMM7_Qa;
  }
  local_cb0 = &buf;
  local_cb8 = 0x3000000020;
  local_cd0 = local_be8;
  local_cd4 = 3000;
  local_c78 = in_R8;
  local_c70 = in_R9;
  cVar1 = (*(code *)(anonymous_namespace)::log_filter_and_prefix_hook)();
  pcVar6 = local_cd0;
  if (cVar1 != '\0') {
    local_cc0 = local_cd0;
    iVar2 = vsnprintf(local_cd0,(long)(int)local_cd4,format,&local_cb8);
    iVar5 = local_cd4 - 0x1a;
    if (local_cd4 < 0x1a) {
      iVar5 = 0;
    }
    if (iVar2 <= (int)local_cd4 && iVar2 >= 0) {
      iVar5 = iVar2;
    }
    local_cd0 = local_cd0 + iVar5;
    local_cc4 = line;
    if ((int)local_cd4 < iVar2 || iVar2 < 0) {
      local_cd4 = local_cd4 - iVar5;
      anon_unknown_0::DoRawLog(&local_cd0,(int *)&local_cd4,"%s"," ... (message truncated)\n");
    }
    else {
      local_cd4 = local_cd4 - iVar5;
      anon_unknown_0::DoRawLog(&local_cd0,(int *)&local_cd4,"\n");
    }
    sVar3 = strlen(local_be8);
    piVar4 = __errno_location();
    iVar5 = *piVar4;
    syscall(1,2,local_be8,sVar3);
    *piVar4 = iVar5;
    pcVar6 = local_cc0;
    line = local_cc4;
  }
  if (severity != kFatal) {
    return;
  }
  (*(code *)(anonymous_namespace)::abort_hook)(file,line,local_be8,pcVar6,&stack0xffffffffffffffd0);
  abort();
}

Assistant:

void RawLog(absl::LogSeverity severity, const char* file, int line,
            const char* format, ...) {
  va_list ap;
  va_start(ap, format);
  RawLogVA(severity, file, line, format, ap);
  va_end(ap);
}